

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_server.c
# Opt level: O0

int start_game(void)

{
  PIPE *pPVar1;
  int iVar2;
  int __dest [2];
  ssize_t sVar3;
  char local_23a8 [8];
  char msg [4096];
  int local_13a0;
  int websocket_fd;
  int game_pipe [2];
  PIPE *shared;
  int shm_id;
  int i;
  PIPE pipes [20];
  int game_infor [64];
  
  printf("Start game server...\n");
  for (shared._4_4_ = 0; shared._4_4_ < 0x14; shared._4_4_ = shared._4_4_ + 1) {
    pipe(&shm_id + (long)shared._4_4_ * 0x3b);
    *(undefined1 *)pipes[shared._4_4_].pipe = 0;
    pPVar1 = pipes + shared._4_4_;
    pPVar1->name[0xb] = '\0';
    pPVar1->name[0xc] = '\0';
    pPVar1->name[0xd] = '\0';
    pPVar1->name[0xe] = '\0';
    memset(pipes[shared._4_4_].name + 0xf,0,0x32);
    strcpy((char *)((long)pipes[shared._4_4_].pipe + 1),"");
  }
  game_pipe[0] = 0;
  game_pipe[1] = 0;
  iVar2 = shmget(0,0x1270,0x7a0);
  if (iVar2 == -1) {
    printf("Sharing memory cannot been created!\n");
  }
  else {
    __dest = (int  [2])shmat(iVar2,(void *)0x0,0);
    game_pipe = __dest;
    if (__dest == (int  [2])0xffffffffffffffff) {
      printf("Cannot link sharing memory to this process!(Game server)\n");
    }
    else {
      memcpy((void *)__dest,&shm_id,0x1270);
      if (__dest == (int  [2])0x0) {
        printf("Cannot set sharing memory data!\n");
      }
      else {
        pipe(&local_13a0);
        msg[0xffc] = '\0';
        msg[0xffd] = '\0';
        msg[0xffe] = '\0';
        msg[0xfff] = '\0';
        msg._4092_4_ = fork();
        if ((msg._4092_4_ == 0) && (iVar2 = start_websocket(0x2382,iVar2,websocket_fd), iVar2 == -1)
           ) {
          printf("Websocket server start failure!\n");
        }
        else {
          while( true ) {
            memset(local_23a8,0,0x1000);
            sVar3 = read(local_13a0,local_23a8,0x1000);
            if (sVar3 < 1) break;
            iVar2 = deal_info(local_23a8,(PIPE *)game_pipe);
            if (iVar2 == -1) {
              printf("The info:%s is illegal!\n");
            }
          }
          printf("Pipe between webSocket and Game server is broken!\n");
        }
      }
    }
  }
  return -1;
}

Assistant:

int start_game(){
    printf("Start game server...\n");
    int game_infor[64];

    struct PIPE pipes[MAX_USER];
    for(int i = 0; i < MAX_USER; i++){
        //pipes[i]= (struct PIPE *)malloc(sizeof(struct PIPE));
        pipe(pipes[i].pipe);
        pipes[i].useState = false;
        pipes[i].level = 0;
        memset(pipes[i].score, 0 ,MAX_SONG);
        strcpy(pipes[i].name, "");
    }

    int shm_id;
    struct PIPE *shared = NULL;
    if((shm_id = shmget(IPC_PRIVATE, sizeof(struct PIPE) * MAX_USER, 0640 | IPC_CREAT | IPC_EXCL)) == -1){
        printf("Sharing memory cannot been created!\n");
        return -1;
    }
    shared = (struct PIPE *)shmat(shm_id, NULL, 0);
    if(shared == (struct PIPE *)-1){
        printf("Cannot link sharing memory to this process!(Game server)\n");
        return -1;
    }
    if(memcpy(shared, pipes,sizeof(struct PIPE) * MAX_USER) == NULL){
        printf("Cannot set sharing memory data!\n");
        return -1;
    }

    int game_pipe[2];
    pipe(game_pipe);

    int websocket_fd = 0;

//    if(init_info(game_infor) == -1){
//        printf("Game infor inti failure!\n");
//        return -1;
//    }
    if((websocket_fd = fork()) == 0){
        if(start_websocket(WEBSOCKET_PORT, shm_id, game_pipe[1]) == -1){
            printf("Websocket server start failure!\n");
            return -1;
        }
    }

    while(true){
        char msg[MSG_MAX_SIZE];
        memset(msg, 0, MSG_MAX_SIZE);
        if(read(game_pipe[0], msg, MSG_MAX_SIZE) <= 0){
            printf("Pipe between webSocket and Game server is broken!\n");
            return -1;
        }
        if(deal_info(msg, shared) == -1){
            printf("The info:%s is illegal!\n", msg);
            continue;
        }
    }
}